

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  IfcActor *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcActor).super_IfcObject + -0x18);
  this_00 = (IfcActor *)(&(this->super_IfcActor).super_IfcObject.field_0x0 + lVar2);
  plVar1 = (long *)(&this->field_0x110 + lVar2);
  plVar1[-0x22] = (long)&PTR__IfcOccupant_008156a0;
  plVar1[2] = (long)&PTR__IfcOccupant_00815768;
  plVar1[-0x11] = (long)&PTR__IfcOccupant_008156c8;
  plVar1[-0xf] = (long)&PTR__IfcOccupant_008156f0;
  plVar1[-8] = (long)&PTR__IfcOccupant_00815718;
  plVar1[-4] = (long)&PTR__IfcOccupant_00815740;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcActor::~IfcActor(this_00,&PTR_construction_vtable_24__00815780);
  operator_delete(this_00,0x138);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}